

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_233176::CreateIndex
                    (VmModule *module,SynBase *source,VmValue *arrayLength,VmValue *elementSize,
                    VmValue *value,VmValue *index,TypeBase *structType)

{
  VmValue *in_RAX;
  VmInstruction *pVVar1;
  VmType type;
  
  if (((arrayLength->type).type != VM_TYPE_INT) || ((arrayLength->type).size != 4)) {
    __assert_fail("arrayLength->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x20d,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  if (((elementSize->type).type == VM_TYPE_INT) && ((elementSize->type).size == 4)) {
    if ((value->type).type != VM_TYPE_POINTER) {
      __assert_fail("value->type.type == VM_TYPE_POINTER",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x20f,
                    "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                   );
    }
    if (((index->type).type == VM_TYPE_INT) && ((index->type).size == 4)) {
      if (structType != (TypeBase *)0x0) {
        type.structType = (TypeBase *)0x16;
        type._0_8_ = structType;
        pVVar1 = CreateInstruction((anon_unknown_dwarf_233176 *)module,(VmModule *)source,
                                   (SynBase *)0x800000006,type,(VmInstructionType)arrayLength,
                                   elementSize,value,index,(VmValue *)0x0,in_RAX);
        return &pVVar1->super_VmValue;
      }
      __assert_fail("structType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                    ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
    }
    __assert_fail("index->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x210,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  __assert_fail("elementSize->type == VmType::Int",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x20e,
                "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
               );
}

Assistant:

VmValue* CreateIndex(VmModule *module, SynBase *source, VmValue *arrayLength, VmValue *elementSize, VmValue *value, VmValue *index, TypeBase *structType)
	{
		assert(arrayLength->type == VmType::Int);
		assert(elementSize->type == VmType::Int);
		assert(value->type.type == VM_TYPE_POINTER);
		assert(index->type == VmType::Int);

		return CreateInstruction(module, source, VmType::Pointer(structType), VM_INST_INDEX, arrayLength, elementSize, value, index);
	}